

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     function_signature<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
               (_func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **f)

{
  _func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **f_local;
  
  Function_Signature<bool,chaiscript::dispatch::detail::Function_Params<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,true,false,false,false>
  ::
  Function_Signature<bool(*const&)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
            ((Function_Signature<bool,chaiscript::dispatch::detail::Function_Params<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,true,false,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }